

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O0

unsigned_long
libssh2_channel_receive_window_adjust(LIBSSH2_CHANNEL *channel,unsigned_long adj,uchar force)

{
  time_t start_time;
  LIBSSH2_CHANNEL *local_40;
  time_t entry_time;
  uint local_28;
  int rc;
  uint window;
  uchar force_local;
  unsigned_long adj_local;
  LIBSSH2_CHANNEL *channel_local;
  
  if (channel == (LIBSSH2_CHANNEL *)0x0) {
    channel_local = (LIBSSH2_CHANNEL *)0xffffffffffffffd9;
  }
  else {
    rc._3_1_ = force;
    _window = adj;
    adj_local = (unsigned_long)channel;
    start_time = time((time_t *)0x0);
    do {
      entry_time._4_4_ =
           _libssh2_channel_receive_window_adjust
                     ((LIBSSH2_CHANNEL *)adj_local,(uint32_t)_window,rc._3_1_,&local_28);
      if ((entry_time._4_4_ != -0x25) || (*(int *)(*(long *)(adj_local + 0x70) + 0xac) == 0)) break;
      entry_time._4_4_ = _libssh2_wait_socket(*(LIBSSH2_SESSION **)(adj_local + 0x70),start_time);
    } while (entry_time._4_4_ == 0);
    if (entry_time._4_4_ == 0) {
      local_40 = (LIBSSH2_CHANNEL *)(ulong)local_28;
    }
    else {
      local_40 = (LIBSSH2_CHANNEL *)(long)entry_time._4_4_;
    }
    channel_local = local_40;
  }
  return (unsigned_long)channel_local;
}

Assistant:

int
_libssh2_channel_receive_window_adjust(LIBSSH2_CHANNEL * channel,
                                       uint32_t adjustment,
                                       unsigned char force,
                                       unsigned int *store)
{
    int rc;

    if(store)
        *store = channel->remote.window_size;

    if(channel->adjust_state == libssh2_NB_state_idle) {
        if(!force
            && (adjustment + channel->adjust_queue <
                LIBSSH2_CHANNEL_MINADJUST)) {
            _libssh2_debug((channel->session, LIBSSH2_TRACE_CONN,
                           "Queueing %u bytes for receive window adjustment "
                           "for channel %u/%u",
                           adjustment, channel->local.id, channel->remote.id));
            channel->adjust_queue += adjustment;
            return 0;
        }

        if(!adjustment && !channel->adjust_queue) {
            return 0;
        }

        adjustment += channel->adjust_queue;
        channel->adjust_queue = 0;

        /* Adjust the window based on the block we just freed */
        channel->adjust_adjust[0] = SSH_MSG_CHANNEL_WINDOW_ADJUST;
        _libssh2_htonu32(&channel->adjust_adjust[1], channel->remote.id);
        _libssh2_htonu32(&channel->adjust_adjust[5], adjustment);
        _libssh2_debug((channel->session, LIBSSH2_TRACE_CONN,
                       "Adjusting window %u bytes for data on "
                       "channel %u/%u",
                       adjustment, channel->local.id, channel->remote.id));

        channel->adjust_state = libssh2_NB_state_created;
    }

    rc = _libssh2_transport_send(channel->session, channel->adjust_adjust, 9,
                                 NULL, 0);
    if(rc == LIBSSH2_ERROR_EAGAIN) {
        _libssh2_error(channel->session, rc,
                       "Would block sending window adjust");
        return rc;
    }
    else if(rc) {
        channel->adjust_queue = adjustment;
        return _libssh2_error(channel->session, LIBSSH2_ERROR_SOCKET_SEND,
                              "Unable to send transfer-window adjustment "
                              "packet, deferring");
    }
    else {
        channel->remote.window_size += adjustment;
    }

    channel->adjust_state = libssh2_NB_state_idle;

    return 0;
}